

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Transform * __thiscall sf::Transform::rotate(Transform *this,float angle)

{
  Transform *pTVar1;
  float fVar2;
  double dVar3;
  undefined1 local_60 [8];
  Transform rotation;
  float sin;
  float cos;
  float rad;
  float angle_local;
  Transform *this_local;
  
  fVar2 = (angle * 3.1415927) / 180.0;
  dVar3 = std::cos((double)(ulong)(uint)fVar2);
  rotation.m_matrix[0xf] = SUB84(dVar3,0);
  dVar3 = std::sin((double)(ulong)(uint)fVar2);
  rotation.m_matrix[0xe] = SUB84(dVar3,0);
  Transform((Transform *)local_60,rotation.m_matrix[0xf],-rotation.m_matrix[0xe],0.0,
            rotation.m_matrix[0xe],rotation.m_matrix[0xf],0.0,0.0,0.0,1.0);
  pTVar1 = combine(this,(Transform *)local_60);
  return pTVar1;
}

Assistant:

Transform& Transform::rotate(float angle)
{
    float rad = angle * 3.141592654f / 180.f;
    float cos = std::cos(rad);
    float sin = std::sin(rad);

    Transform rotation(cos, -sin, 0,
                       sin,  cos, 0,
                       0,    0,   1);

    return combine(rotation);
}